

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_for_node.cpp
# Opt level: O0

void __thiscall
decorator_for_node_for_true_Test::decorator_for_node_for_true_Test
          (decorator_for_node_for_true_Test *this)

{
  decorator_for_node_for_true_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__decorator_for_node_for_true_Test_001f1a90;
  return;
}

Assistant:

TEST(decorator_for_node, for_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"decorator_for_node\" count = \"5\">"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(5, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}